

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void ar(double *inp,int N,int p,int method,double *phi,double *var)

{
  double *resid_00;
  double *hess_00;
  int cssml;
  double *hess;
  double *resid;
  double loglik;
  double wmean;
  double *var_local;
  double *phi_local;
  int local_38;
  int method_local;
  int p_local;
  int N_local;
  double *inp_local;
  
  wmean = (double)var;
  var_local = phi;
  phi_local._4_4_ = method;
  local_38 = p;
  method_local = N;
  _p_local = inp;
  if (method == 0) {
    ywalg2(inp,N,p,phi,var);
  }
  else if (method == 1) {
    burgalg(inp,N + -1,p,phi,var);
  }
  else if (method == 2) {
    resid_00 = (double *)malloc((long)N << 3);
    hess_00 = (double *)malloc((long)(local_38 + 1) * 8 * (long)(local_38 + 1));
    as154(_p_local,method_local,7,local_38,0,0,var_local,(double *)0x0,&loglik,(double *)wmean,
          resid_00,(double *)&resid,hess_00,0);
    free(resid_00);
    free(hess_00);
  }
  else {
    printf("The program only accepts 0,1 and 2 as input values for method");
  }
  return;
}

Assistant:

void ar(double *inp, int N, int p,int method,double *phi,double *var) {
	/*
	Method 0 : Yule Walker
	Method 1 : Burg
	Method 2 : MLE
	*/

	double wmean,loglik;
	double *resid,*hess;
	int cssml = 0;

	if (method == 0) {
		ywalg2(inp, N, p, phi,var);
	}
	else if (method == 1) {
		burgalg(inp, N - 1, p, phi, var);
	}
	else if (method == 2) {
		resid = (double*)malloc(sizeof(double)* N);
		hess = (double*)malloc(sizeof(double)* (p+1) * (p+1));
		as154(inp,N,7,p,0,0,phi,NULL, &wmean, var, resid, &loglik,hess,cssml);
		free(resid);
		free(hess);
	}
	else {
		printf("The program only accepts 0,1 and 2 as input values for method");
	}

}